

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mipmapped_texture::is_x_flipped(mipmapped_texture *this)

{
  bool bVar1;
  uint uVar2;
  vector<crnlib::mip_level_*> *pvVar3;
  mip_level **ppmVar4;
  uint local_20;
  uint local_1c;
  uint m;
  uint l;
  mipmapped_texture *this_local;
  
  local_1c = 0;
  do {
    uVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&this->m_faces);
    if (uVar2 <= local_1c) {
      return false;
    }
    local_20 = 0;
    while( true ) {
      pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_1c);
      uVar2 = vector<crnlib::mip_level_*>::size(pvVar3);
      if (uVar2 <= local_20) break;
      pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_1c);
      ppmVar4 = vector<crnlib::mip_level_*>::operator[](pvVar3,local_20);
      bVar1 = mip_level::is_x_flipped(*ppmVar4);
      if (bVar1) {
        return true;
      }
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool mipmapped_texture::is_x_flipped() const {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      if (m_faces[l][m]->is_x_flipped())
        return true;

  return false;
}